

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorDynSize.cpp
# Opt level: O1

VectorDynSize * __thiscall
iDynTree::VectorDynSize::operator=(VectorDynSize *this,Span<const_double,__1L> vec)

{
  extent_type<_1L> _newCapacity;
  
  _newCapacity = vec.storage_.super_extent_type<_1L>.size_;
  if (this->m_size != _newCapacity.size_) {
    if (this->m_capacity < (ulong)_newCapacity.size_) {
      changeCapacityAndCopyData(this,_newCapacity.size_);
    }
    this->m_size = _newCapacity.size_;
  }
  if (this->m_size != 0) {
    memcpy(this->m_data,vec.storage_.data_,this->m_size << 3);
  }
  return this;
}

Assistant:

VectorDynSize &VectorDynSize::operator=(Span<const double> vec)
{
    // if the size don't match, reallocate the data
    if( this->m_size != vec.size() )
    {
        resize(static_cast<std::size_t>(vec.size()));
    }

    // After reallocation, the size should match
    assert(this->m_size == vec.size());

    // Copy data if the size is not 0
    if( this->m_size > 0 )
    {
        std::memcpy(this->m_data, vec.data(), this->m_size*sizeof(double));
    }

    return *this;
}